

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g80_atom32.cc
# Opt level: O0

int atom32_prep_code(hwtest_ctx *ctx,uint32_t op1,uint32_t op2)

{
  uint32_t uVar1;
  int iVar2;
  uint local_8c;
  uint32_t local_88;
  uint i;
  uint32_t code [26];
  uint32_t op2_local;
  uint32_t op1_local;
  hwtest_ctx *ctx_local;
  
  local_88 = 0x30020001;
  i = 0xc4100780;
  code[0] = 0x20008005;
  code[1] = 0x83;
  code[2] = 0x20008009;
  code[3] = 0x103;
  code[4] = 0x2000800d;
  code[5] = 0x183;
  code[6] = 0x100f8011;
  code[7] = 3;
  code[8] = 0x801;
  code[9] = 0xa0000780;
  code[10] = 0xd0000215;
  code[0xb] = 0x80c00780;
  code[0xc] = 0xd0000419;
  code[0xd] = 0x80c00780;
  code[0x10] = 0xd000041d;
  code[0x11] = 0xa0c00780;
  code[0x12] = 0x1d;
  code[0x13] = 0x20000780;
  code[0x14] = 0xd000021d;
  code[0x15] = 0xa0c00780;
  code[0x16] = 0xf0000001;
  code[0x17] = 0xe0000781;
  code[0xe] = op1;
  code[0xf] = op2;
  nva_wr32(ctx->cnum,0x1700,0x100);
  for (local_8c = 0; local_8c < 0x1a; local_8c = local_8c + 1) {
    nva_wr32(ctx->cnum,local_8c * 4 + 0x730000,(&local_88)[local_8c]);
  }
  nva_wr32(ctx->cnum,0x70000,1);
  do {
    uVar1 = nva_rd32(ctx->cnum,0x70000);
  } while (uVar1 != 0);
  iVar2 = g80_gr_mthd(ctx,3,0x380,0);
  return iVar2;
}

Assistant:

static int atom32_prep_code(struct hwtest_ctx *ctx, uint32_t op1, uint32_t op2) {
	uint32_t code[] = {
		0x30020001,
		0xc4100780,
		0x20008005,
		0x00000083,
		0x20008009,
		0x00000103,
		0x2000800d,
		0x00000183,
		0x100f8011,
		0x00000003,
		0x00000801,
		0xa0000780,
		0xd0000215,
		0x80c00780,
		0xd0000419,
		0x80c00780,
		op1,
		op2,
		0xd000041d,
		0xa0c00780,
		0x0000001d,
		0x20000780,
		0xd000021d,
		0xa0c00780,
		0xf0000001,
		0xe0000781,
	};
	unsigned i;
	/* Poke code and flush it. */
	nva_wr32(ctx->cnum, 0x1700, 0x100);
	for (i = 0; i < ARRAY_SIZE(code); i++)
		nva_wr32(ctx->cnum, 0x730000 + i * 4, code[i]);
	nva_wr32(ctx->cnum, 0x70000, 1);
	while (nva_rd32(ctx->cnum, 0x70000));
	return g80_gr_mthd(ctx, 3, 0x380, 0);
}